

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyRwr.c
# Opt level: O3

void Ivy_GraphUpdateNetwork3
               (Ivy_Man_t *p,Ivy_Obj_t *pRoot,Dec_Graph_t *pGraph,int fUpdateLevel,int nGain)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  Ivy_Obj_t *pIVar6;
  void *pvVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  
  iVar2 = p->nObjs[5];
  iVar3 = p->nObjs[6];
  lVar8 = *(long *)((long)p->pData + 0x90);
  lVar5 = (long)*(int *)(lVar8 + 4);
  if (0 < lVar5) {
    lVar8 = *(long *)(lVar8 + 8);
    lVar9 = 0;
    do {
      piVar1 = (int *)((*(ulong *)(lVar8 + lVar9 * 8) & 0xfffffffffffffffe) + 0xc);
      *piVar1 = *piVar1 + 1;
      lVar9 = lVar9 + 1;
    } while (lVar5 != lVar9);
  }
  iVar4 = pRoot->nRefs;
  pRoot->nRefs = 0;
  Ivy_ObjDelete_rec(p,pRoot,0);
  pRoot->nRefs = iVar4;
  lVar8 = *(long *)((long)p->pData + 0x90);
  lVar5 = (long)*(int *)(lVar8 + 4);
  if (0 < lVar5) {
    lVar8 = *(long *)(lVar8 + 8);
    lVar9 = 0;
    do {
      uVar10 = *(ulong *)(lVar8 + lVar9 * 8) & 0xfffffffffffffffe;
      iVar4 = *(int *)(uVar10 + 0xc);
      if (iVar4 < 1) {
        __assert_fail("pObj->nRefs > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivy.h"
                      ,0x10a,"void Ivy_ObjRefsDec(Ivy_Obj_t *)");
      }
      *(int *)(uVar10 + 0xc) = iVar4 + -1;
      lVar9 = lVar9 + 1;
    } while (lVar5 != lVar9);
  }
  pIVar6 = Ivy_GraphToNetwork(p,pGraph);
  Ivy_ObjReplace(p,pRoot,pIVar6,0,0,1);
  pvVar7 = p->pData;
  lVar8 = *(long *)((long)pvVar7 + 0x90);
  if (0 < *(int *)(lVar8 + 4)) {
    lVar5 = 0;
    do {
      pIVar6 = (Ivy_Obj_t *)(*(ulong *)(*(long *)(lVar8 + 8) + lVar5 * 8) & 0xfffffffffffffffe);
      if (((pIVar6->field_0x8 & 0xf) != 0) && (pIVar6->nRefs == 0)) {
        Ivy_ObjDelete_rec(p,pIVar6,1);
        pvVar7 = p->pData;
      }
      lVar5 = lVar5 + 1;
      lVar8 = *(long *)((long)pvVar7 + 0x90);
    } while (lVar5 < *(int *)(lVar8 + 4));
  }
  if (nGain <= (iVar3 + iVar2) - (p->nObjs[5] + p->nObjs[6])) {
    return;
  }
  __assert_fail("nGain <= nNodesOld - nNodesNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyRwr.c"
                ,0x260,
                "void Ivy_GraphUpdateNetwork3(Ivy_Man_t *, Ivy_Obj_t *, Dec_Graph_t *, int, int)");
}

Assistant:

void Ivy_GraphUpdateNetwork3( Ivy_Man_t * p, Ivy_Obj_t * pRoot, Dec_Graph_t * pGraph, int fUpdateLevel, int nGain )
{
    Ivy_Obj_t * pRootNew, * pFanin;
    int nNodesNew, nNodesOld, i, nRefsOld;
    nNodesOld = Ivy_ManNodeNum(p);

//printf( "Before = %d. ", Ivy_ManNodeNum(p) );
    // mark the cut
    Vec_PtrForEachEntry( Ivy_Obj_t *, ((Rwt_Man_t *)p->pData)->vFanins, pFanin, i )
        Ivy_ObjRefsInc( Ivy_Regular(pFanin) );
    // deref the old cone
    nRefsOld = pRoot->nRefs;  
    pRoot->nRefs = 0;
    Ivy_ObjDelete_rec( p, pRoot, 0 );
    pRoot->nRefs = nRefsOld;
    // unmark the cut
    Vec_PtrForEachEntry( Ivy_Obj_t *, ((Rwt_Man_t *)p->pData)->vFanins, pFanin, i )
        Ivy_ObjRefsDec( Ivy_Regular(pFanin) );
//printf( "Deref = %d. ", Ivy_ManNodeNum(p) );
 
    // create the new structure of nodes
    pRootNew = Ivy_GraphToNetwork( p, pGraph );
//printf( "Create = %d. ", Ivy_ManNodeNum(p) );
    // remove the old nodes
//    Ivy_AigReplace( pMan->pManFunc, pRoot, pRootNew, fUpdateLevel );
/*
    if ( Ivy_IsComplement(pRootNew) )
        printf( "c" );
    else
        printf( "d" );
    if ( Ivy_ObjRefs(Ivy_Regular(pRootNew)) > 0 )
        printf( "%d", Ivy_ObjRefs(Ivy_Regular(pRootNew)) );
    printf( " " );
*/
    Ivy_ObjReplace( p, pRoot, pRootNew, 0, 0, 1 );
//printf( "Replace = %d. ", Ivy_ManNodeNum(p) );

    // delete remaining dangling nodes
    Vec_PtrForEachEntry( Ivy_Obj_t *, ((Rwt_Man_t *)p->pData)->vFanins, pFanin, i )
    {
        pFanin = Ivy_Regular(pFanin);
        if ( !Ivy_ObjIsNone(pFanin) && Ivy_ObjRefs(pFanin) == 0 )
            Ivy_ObjDelete_rec( p, pFanin, 1 );
    }
//printf( "Deref = %d. ", Ivy_ManNodeNum(p) );
//printf( "\n" );

    // compare the gains
    nNodesNew = Ivy_ManNodeNum(p);
    assert( nGain <= nNodesOld - nNodesNew );
}